

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  bool bVar1;
  deUint32 queueFamilyIndex_;
  VkAllocationCallbacks *pVVar2;
  PlatformInterface *vkp_;
  DeviceInterface *vkd_;
  VkDevice device_;
  ProgramCollection<vk::ProgramBinary> *programBinaries_;
  TestContext *pTVar3;
  TestLog *pTVar4;
  allocator<char> local_939;
  string local_938;
  allocator<char> local_911;
  string local_910;
  allocator<char> local_8e9;
  string local_8e8;
  uint local_8c8;
  allocator<char> local_8c1;
  string local_8c0;
  Move<vk::Handle<(vk::HandleType)8>_> local_8a0;
  RefData<vk::Handle<(vk::HandleType)8>_> local_880;
  undefined1 local_860 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> obj;
  Environment objEnv;
  AllocationCallbackRecorder objCallbacks;
  undefined8 uStack_7a0;
  Resources res;
  undefined1 local_798 [8];
  EnvClone resEnv;
  undefined1 local_c8 [8];
  Environment rootEnv;
  AllocationCallbackRecorder resCallbacks;
  deUint32 noCmdScope;
  Context *context_local;
  Parameters params_local;
  
  params_local.size._0_4_ = (undefined4)params.size;
  context_local = context;
  params_local._8_8_ = __return_storage_ptr__;
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers,pVVar2,0x80);
  vkp_ = Context::getPlatformInterface((Context *)this);
  vkd_ = Context::getDeviceInterface((Context *)this);
  device_ = Context::getDevice((Context *)this);
  queueFamilyIndex_ = Context::getUniversalQueueFamilyIndex((Context *)this);
  programBinaries_ = Context::getBinaryCollection((Context *)this);
  pVVar2 = ::vk::AllocationCallbacks::getCallbacks
                     ((AllocationCallbacks *)&rootEnv.maxResourceConsumers);
  Environment::Environment
            ((Environment *)local_c8,vkp_,vkd_,device_,queueFamilyIndex_,programBinaries_,pVVar2,1);
  uStack_7a0 = getDefaulDeviceParameters((Context *)this);
  EnvClone::EnvClone((EnvClone *)local_798,(Environment *)local_c8,
                     (Parameters *)&stack0xfffffffffffff860,1);
  Buffer::Resources::Resources
            ((Resources *)((long)&objCallbacks.m_records.m_last + 7),
             (Environment *)&resEnv.vkd.m_vk.getPastPresentationTimingGOOGLE,
             (Parameters *)&context_local);
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,pVVar2,0x80);
  pVVar2 = ::vk::AllocationCallbacks::getCallbacks
                     ((AllocationCallbacks *)&objEnv.maxResourceConsumers);
  Environment::Environment
            ((Environment *)
             &obj.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator,
             (PlatformInterface *)resEnv.vkd.m_vk.getPastPresentationTimingGOOGLE,
             (DeviceInterface *)resEnv.env.vkp,(VkDevice)resEnv.env.vkd,(deUint32)resEnv.env.device,
             (BinaryCollection *)resEnv.env._24_8_,pVVar2,(deUint32)resEnv.env.allocationCallbacks);
  Buffer::create(&local_8a0,
                 (Environment *)
                 &obj.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator,
                 (Resources *)((long)&objCallbacks.m_records.m_last + 7),
                 (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_880,(Move *)&local_8a0);
  data.deleter.m_deviceIface._0_4_ = (int)local_880.deleter.m_deviceIface;
  data.object.m_internal = local_880.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_880.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_880.deleter.m_device;
  data.deleter.m_allocator = local_880.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_860,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_8a0);
  pTVar3 = Context::getTestContext((Context *)this);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  bVar1 = ::vk::validateAndLog
                    (pTVar4,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0x1e);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c0,"Invalid allocation callback",&local_8c1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_8c0);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator(&local_8c1);
  }
  local_8c8 = (uint)!bVar1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_860);
  if (local_8c8 == 0) {
    pTVar3 = Context::getTestContext((Context *)this);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    bVar1 = ::vk::validateAndLog
                      (pTVar4,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0);
    if (bVar1) {
      local_8c8 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8e8,"Invalid allocation callback",&local_8e9);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_8e8);
      std::__cxx11::string::~string((string *)&local_8e8);
      std::allocator<char>::~allocator(&local_8e9);
      local_8c8 = 1;
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers);
  EnvClone::~EnvClone((EnvClone *)local_798);
  if (local_8c8 == 0) {
    pTVar3 = Context::getTestContext((Context *)this);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    bVar1 = ::vk::validateAndLog
                      (pTVar4,(AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers,0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"Ok",&local_939);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_938);
      std::__cxx11::string::~string((string *)&local_938);
      std::allocator<char>::~allocator(&local_939);
      local_8c8 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_910,"Invalid allocation callback",&local_911);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_910);
      std::__cxx11::string::~string((string *)&local_910);
      std::allocator<char>::~allocator(&local_911);
      local_8c8 = 1;
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&rootEnv.maxResourceConsumers);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}